

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_posix.c
# Opt level: O2

void thread_free(thread_handle *pt)

{
  void *pvVar1;
  
  pvVar1 = pt->priv;
  if (pvVar1 != (void *)0x0) {
    thread_join(pt);
    mutex_free((mutex_handle *)((long)pvVar1 + 8));
    free(pt->priv);
    pt->priv = (void *)0x0;
  }
  return;
}

Assistant:

void thread_free(struct thread_handle *pt)
{
	struct thread_priv *priv = pt->priv;

	if (pt->priv != NULL) {
		thread_join(pt);

		mutex_free(&priv->mutex);

		free(pt->priv);
		pt->priv = NULL;
	}
}